

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O0

_Bool names_are_equal(nbt_node *node,void *vname)

{
  int iVar1;
  char *name;
  void *vname_local;
  nbt_node *node_local;
  
  if (node != (nbt_node *)0x0) {
    if ((vname == (void *)0x0) && (node->name == (char *)0x0)) {
      node_local._7_1_ = true;
    }
    else if ((vname == (void *)0x0) || (node->name == (char *)0x0)) {
      node_local._7_1_ = false;
    }
    else {
      iVar1 = strcmp(node->name,(char *)vname);
      node_local._7_1_ = iVar1 == 0;
    }
    return node_local._7_1_;
  }
  __assert_fail("node",
                "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                0x18e,"_Bool names_are_equal(const nbt_node *, void *)");
}

Assistant:

static bool names_are_equal(const nbt_node* node, void* vname)
{
    const char* name = vname;

    assert(node);

    if(name == NULL && node->name == NULL)
        return true;

    if(name == NULL || node->name == NULL)
        return false;

    return strcmp(node->name, name) == 0;
}